

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_scriptedmarine.cpp
# Opt level: O0

void __thiscall AScriptedMarine::SetWeapon(AScriptedMarine *this,EMarineWeapon type)

{
  bool bVar1;
  PClass *type_00;
  AActor *pAVar2;
  PClass *cls;
  EMarineWeapon type_local;
  AScriptedMarine *this_local;
  
  bVar1 = GetWeaponStates(this,type,&(this->super_AActor).MeleeState,
                          &(this->super_AActor).MissileState);
  if (bVar1) {
    type_00 = PClass::FindClass(SetWeapon::classes[type]);
    if (type_00 == (PClass *)0x0) {
      (this->super_AActor).DecalGenerator = (FDecalBase *)0x0;
    }
    else {
      pAVar2 = GetDefaultByType(type_00);
      (this->super_AActor).DecalGenerator = pAVar2->DecalGenerator;
    }
  }
  return;
}

Assistant:

void AScriptedMarine::SetWeapon (EMarineWeapon type)
{
	if (GetWeaponStates(type, MeleeState, MissileState))
	{
		static const char *classes[] = {
			"ScriptedMarine",
			"MarineFist",
			"MarineBerserk",
			"MarineChainsaw",
			"MarinePistol",
			"MarineShotgun",
			"MarineSSG",
			"MarineChaingun",
			"MarineRocket",
			"MarinePlasma",
			"MarineRailgun",
			"MarineBFG"
		};

		const PClass *cls = PClass::FindClass(classes[type]);
		if (cls != NULL)
			DecalGenerator = GetDefaultByType(cls)->DecalGenerator;
		else 
			DecalGenerator = NULL;
	}
}